

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CJumpConditionalStatement::Copy(CJumpConditionalStatement *this)

{
  undefined1 uVar1;
  _func_int **pp_Var2;
  long in_RSI;
  _func_int *local_40;
  _func_int *local_38;
  INode local_30;
  _Alloc_hider local_28;
  
  pp_Var2 = (_func_int **)operator_new(0x30);
  uVar1 = *(undefined1 *)(in_RSI + 0x28);
  (**(code **)(**(long **)(in_RSI + 8) + 0x18))(&local_38);
  (**(code **)(**(long **)(in_RSI + 0x10) + 0x18))(&local_40);
  CLabelStatement::CastCopy((CLabelStatement *)&local_30);
  CLabelStatement::CastCopy((CLabelStatement *)&local_28);
  *pp_Var2 = (_func_int *)&PTR_Accept_0017b058;
  pp_Var2[1] = local_38;
  pp_Var2[2] = local_40;
  pp_Var2[3] = (_func_int *)local_30._vptr_INode;
  pp_Var2[4] = (_func_int *)local_28._M_p;
  *(undefined1 *)(pp_Var2 + 5) = uVar1;
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode = pp_Var2;
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CJumpConditionalStatement::Copy( ) const {
    return std::move( std::unique_ptr<const CStatement>(
            new CJumpConditionalStatement( operation,
                                           leftOperand->Copy( ),
                                           rightOperand->Copy( ),
                                           labelTrue->CastCopy( ),
                                           labelFalse->CastCopy( ))));
}